

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulkan_mock.cpp
# Opt level: O0

void shim_vkDestroyDevice(VkDevice device,VkAllocationCallbacks *pAllocator)

{
  bool bVar1;
  vector<VkDevice_T_*,_std::allocator<VkDevice_T_*>_> *this;
  vector<VulkanMock::CreatedDeviceDetails,_std::allocator<VulkanMock::CreatedDeviceDetails>_>
  *this_00;
  __normal_iterator<VulkanMock::CreatedDeviceDetails_*,_std::vector<VulkanMock::CreatedDeviceDetails,_std::allocator<VulkanMock::CreatedDeviceDetails>_>_>
  local_90;
  __normal_iterator<VulkanMock::CreatedDeviceDetails_*,_std::vector<VulkanMock::CreatedDeviceDetails,_std::allocator<VulkanMock::CreatedDeviceDetails>_>_>
  local_88;
  const_iterator local_80;
  VkDevice_T **local_78;
  const_iterator local_70;
  __normal_iterator<VkDevice_T_**,_std::vector<VkDevice_T_*,_std::allocator<VkDevice_T_*>_>_>
  local_68;
  difference_type local_60;
  difference_type index;
  VkDevice_T **local_50;
  __normal_iterator<VkDevice_T_**,_std::vector<VkDevice_T_*,_std::allocator<VkDevice_T_*>_>_>
  local_48;
  __normal_iterator<VkDevice_T_**,_std::vector<VkDevice_T_*,_std::allocator<VkDevice_T_*>_>_>
  local_40;
  __normal_iterator<VkDevice_T_**,_std::vector<VkDevice_T_*,_std::allocator<VkDevice_T_*>_>_> it;
  PhysicalDeviceDetails *physical_devices;
  iterator __end1;
  iterator __begin1;
  vector<VulkanMock::PhysicalDeviceDetails,_std::allocator<VulkanMock::PhysicalDeviceDetails>_>
  *__range1;
  VkAllocationCallbacks *pAllocator_local;
  VkDevice device_local;
  
  pAllocator_local = (VkAllocationCallbacks *)device;
  __end1 = std::
           vector<VulkanMock::PhysicalDeviceDetails,_std::allocator<VulkanMock::PhysicalDeviceDetails>_>
           ::begin(&mock.physical_devices_details);
  physical_devices =
       (PhysicalDeviceDetails *)
       std::
       vector<VulkanMock::PhysicalDeviceDetails,_std::allocator<VulkanMock::PhysicalDeviceDetails>_>
       ::end(&mock.physical_devices_details);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<VulkanMock::PhysicalDeviceDetails_*,_std::vector<VulkanMock::PhysicalDeviceDetails,_std::allocator<VulkanMock::PhysicalDeviceDetails>_>_>
                                     *)&physical_devices), bVar1) {
    it._M_current =
         (VkDevice_T **)
         __gnu_cxx::
         __normal_iterator<VulkanMock::PhysicalDeviceDetails_*,_std::vector<VulkanMock::PhysicalDeviceDetails,_std::allocator<VulkanMock::PhysicalDeviceDetails>_>_>
         ::operator*(&__end1);
    local_48._M_current =
         (VkDevice_T **)
         std::begin<std::vector<VkDevice_T*,std::allocator<VkDevice_T*>>>
                   (&((reference)it._M_current)->created_device_handles);
    local_50 = (VkDevice_T **)
               std::end<std::vector<VkDevice_T*,std::allocator<VkDevice_T*>>>
                         ((vector<VkDevice_T_*,_std::allocator<VkDevice_T_*>_> *)
                          (it._M_current + 0xcd));
    local_40 = std::
               find<__gnu_cxx::__normal_iterator<VkDevice_T**,std::vector<VkDevice_T*,std::allocator<VkDevice_T*>>>,VkDevice_T*>
                         (local_48,(__normal_iterator<VkDevice_T_**,_std::vector<VkDevice_T_*,_std::allocator<VkDevice_T_*>_>_>
                                    )local_50,(VkDevice_T **)&pAllocator_local);
    index = (difference_type)
            std::end<std::vector<VkDevice_T*,std::allocator<VkDevice_T*>>>
                      ((vector<VkDevice_T_*,_std::allocator<VkDevice_T_*>_> *)(it._M_current + 0xcd)
                      );
    bVar1 = __gnu_cxx::operator!=
                      (&local_40,
                       (__normal_iterator<VkDevice_T_**,_std::vector<VkDevice_T_*,_std::allocator<VkDevice_T_*>_>_>
                        *)&index);
    if (bVar1) {
      local_68._M_current =
           (VkDevice_T **)
           std::vector<VkDevice_T_*,_std::allocator<VkDevice_T_*>_>::begin
                     ((vector<VkDevice_T_*,_std::allocator<VkDevice_T_*>_> *)(it._M_current + 0xcd))
      ;
      local_60 = __gnu_cxx::operator-(&local_40,&local_68);
      this = (vector<VkDevice_T_*,_std::allocator<VkDevice_T_*>_> *)(it._M_current + 0xcd);
      __gnu_cxx::
      __normal_iterator<VkDevice_T*const*,std::vector<VkDevice_T*,std::allocator<VkDevice_T*>>>::
      __normal_iterator<VkDevice_T**>
                ((__normal_iterator<VkDevice_T*const*,std::vector<VkDevice_T*,std::allocator<VkDevice_T*>>>
                  *)&local_70,&local_40);
      local_78 = (VkDevice_T **)
                 std::vector<VkDevice_T_*,_std::allocator<VkDevice_T_*>_>::erase(this,local_70);
      this_00 = (vector<VulkanMock::CreatedDeviceDetails,_std::allocator<VulkanMock::CreatedDeviceDetails>_>
                 *)(it._M_current + 0xd0);
      local_90._M_current =
           (CreatedDeviceDetails *)
           std::
           vector<VulkanMock::CreatedDeviceDetails,_std::allocator<VulkanMock::CreatedDeviceDetails>_>
           ::begin((vector<VulkanMock::CreatedDeviceDetails,_std::allocator<VulkanMock::CreatedDeviceDetails>_>
                    *)(it._M_current + 0xd0));
      local_88 = __gnu_cxx::
                 __normal_iterator<VulkanMock::CreatedDeviceDetails_*,_std::vector<VulkanMock::CreatedDeviceDetails,_std::allocator<VulkanMock::CreatedDeviceDetails>_>_>
                 ::operator+(&local_90,local_60);
      __gnu_cxx::
      __normal_iterator<VulkanMock::CreatedDeviceDetails_const*,std::vector<VulkanMock::CreatedDeviceDetails,std::allocator<VulkanMock::CreatedDeviceDetails>>>
      ::__normal_iterator<VulkanMock::CreatedDeviceDetails*>
                ((__normal_iterator<VulkanMock::CreatedDeviceDetails_const*,std::vector<VulkanMock::CreatedDeviceDetails,std::allocator<VulkanMock::CreatedDeviceDetails>>>
                  *)&local_80,&local_88);
      std::
      vector<VulkanMock::CreatedDeviceDetails,_std::allocator<VulkanMock::CreatedDeviceDetails>_>::
      erase(this_00,local_80);
    }
    __gnu_cxx::
    __normal_iterator<VulkanMock::PhysicalDeviceDetails_*,_std::vector<VulkanMock::PhysicalDeviceDetails,_std::allocator<VulkanMock::PhysicalDeviceDetails>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

VKAPI_ATTR void VKAPI_CALL shim_vkDestroyDevice(
    [[maybe_unused]] VkDevice device, [[maybe_unused]] const VkAllocationCallbacks* pAllocator) {
    for (auto& physical_devices : mock.physical_devices_details) {
        auto it = std::find(
            std::begin(physical_devices.created_device_handles), std::end(physical_devices.created_device_handles), device);
        if (it != std::end(physical_devices.created_device_handles)) {
            auto index = it - physical_devices.created_device_handles.begin();
            physical_devices.created_device_handles.erase(it);
            physical_devices.created_device_details.erase(physical_devices.created_device_details.begin() + index);
        }
    }
}